

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseXMLDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  xmlChar *pxVar5;
  byte *pbVar6;
  uint uVar7;
  xmlParserInputPtr pxVar8;
  xmlChar *in_R8;
  
  pxVar8 = ctxt->input;
  pxVar8->standalone = -2;
  pxVar5 = pxVar8->cur;
  if (*pxVar5 == '<') {
    ctxt->mlType = XML_TYPE_XML;
    pxVar8->cur = pxVar5 + 5;
    pxVar8->col = pxVar8->col + 5;
    xVar1 = pxVar5[5];
  }
  else {
    ctxt->mlType = XML_TYPE_SML;
    pxVar8->cur = pxVar5 + 4;
    pxVar8->col = pxVar8->col + 4;
    xVar1 = pxVar5[4];
  }
  if (xVar1 == '\0') {
    xmlParserInputGrow(pxVar8,0xfa);
  }
  uVar4 = (ulong)*ctxt->input->cur;
  if ((0x20 < uVar4) || ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0)) {
    xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Blank needed after \'<?xml\'\n");
  }
  xmlSkipBlankChars(ctxt);
  pxVar5 = xmlParseVersionInfo(ctxt);
  if (pxVar5 == (xmlChar *)0x0) {
    xmlFatalErr(ctxt,XML_ERR_VERSION_MISSING,(char *)0x0);
  }
  else {
    iVar3 = xmlStrEqual(pxVar5,"1.0");
    if (iVar3 == 0) {
      if ((((ctxt->options & 0x20000) == 0) && (*pxVar5 == '1')) && (pxVar5[1] == '.')) {
        xmlWarningMsg(ctxt,XML_WAR_UNKNOWN_VERSION,"Unsupported version \'%s\'\n",pxVar5,in_R8);
      }
      else {
        xmlFatalErrMsgStr(ctxt,XML_ERR_UNKNOWN_VERSION,"Unsupported version \'%s\'\n",pxVar5);
      }
    }
    if (ctxt->version != (xmlChar *)0x0) {
      (*xmlFree)(ctxt->version);
    }
    ctxt->version = pxVar5;
  }
  pxVar8 = ctxt->input;
  pbVar6 = pxVar8->cur;
  bVar2 = *pbVar6;
  if (ctxt->mlType == XML_TYPE_XML) {
    uVar7 = (uint)bVar2;
    if (0x3f < uVar7) {
LAB_001677b8:
      xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Blank needed here\n");
      goto LAB_001677cc;
    }
    if ((0x100002600U >> ((ulong)uVar7 & 0x3f) & 1) != 0) goto LAB_001677cc;
    if (((ulong)uVar7 != 0x3f) || (pbVar6[1] != 0x3e)) goto LAB_001677b8;
LAB_001678fb:
    pxVar8->cur = pbVar6 + 2;
    pxVar8->col = pxVar8->col + 2;
    bVar2 = pbVar6[2];
  }
  else {
    if (bVar2 < 0xd) {
      if (bVar2 != 9) {
        if (bVar2 == 10) {
          return;
        }
        goto LAB_001677b8;
      }
LAB_001677cc:
      xmlParseEncodingDecl(ctxt);
      if (ctxt->errNo == 0x20) {
        return;
      }
      if (ctxt->instate == XML_PARSER_EOF) {
        return;
      }
      pxVar8 = ctxt->input;
      if (ctxt->mlType == XML_TYPE_XML) {
        if (pxVar8->encoding != (xmlChar *)0x0) {
          pbVar6 = pxVar8->cur;
          uVar4 = (ulong)*pbVar6;
          if (uVar4 < 0x40) {
            if ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_00167886;
            if ((uVar4 == 0x3f) && (pbVar6[1] == 0x3e)) goto LAB_001678fb;
          }
          goto LAB_00167872;
        }
      }
      else {
        pbVar6 = pxVar8->cur;
        bVar2 = *pbVar6;
        if (bVar2 < 0xd) {
          if (bVar2 != 9) {
            if (bVar2 == 10) {
              return;
            }
            goto LAB_00167872;
          }
        }
        else if ((bVar2 != 0xd) && (bVar2 != 0x20)) {
          if (bVar2 == 0x3b) goto LAB_00167919;
LAB_00167872:
          xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Blank needed here\n");
        }
      }
LAB_00167886:
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      xmlSkipBlankChars(ctxt);
      iVar3 = xmlParseSDDecl(ctxt);
      ctxt->input->standalone = iVar3;
      xmlSkipBlankChars(ctxt);
      pxVar8 = ctxt->input;
      pbVar6 = pxVar8->cur;
      bVar2 = *pbVar6;
      if (ctxt->mlType == XML_TYPE_XML) {
        if (bVar2 == 0x3e) {
          xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
LAB_0016799a:
          xmlNextChar(ctxt);
          return;
        }
        if ((bVar2 != 0x3f) || (pbVar6[1] != 0x3e)) {
          xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
          pxVar8 = ctxt->input;
          pxVar5 = pxVar8->cur;
          while( true ) {
            if ((*pxVar5 == '\0') || (*pxVar5 == '>')) break;
            pxVar8->cur = pxVar5 + 1;
            pxVar5 = pxVar5 + 1;
          }
          goto LAB_0016799a;
        }
        goto LAB_001678fb;
      }
      if (bVar2 == 10) {
        return;
      }
      if (bVar2 != 0x3b) {
        xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
        pxVar8 = ctxt->input;
        pbVar6 = pxVar8->cur;
        while( true ) {
          bVar2 = *pbVar6;
          if (((((ulong)bVar2 < 0x3c) && ((0x800000000000401U >> ((ulong)bVar2 & 0x3f) & 1) != 0))
              || (bVar2 == 0x5d)) || (bVar2 == 0x7d)) break;
          pxVar8->cur = pbVar6 + 1;
          pbVar6 = pbVar6 + 1;
        }
        goto LAB_0016799a;
      }
    }
    else {
      if ((bVar2 == 0xd) || (bVar2 == 0x20)) goto LAB_001677cc;
      if (bVar2 != 0x3b) goto LAB_001677b8;
    }
LAB_00167919:
    pxVar8->cur = pbVar6 + 1;
    pxVar8->col = pxVar8->col + 1;
    bVar2 = pbVar6[1];
  }
  if (bVar2 != 0) {
    return;
  }
  xmlParserInputGrow(pxVar8,0xfa);
  return;
}

Assistant:

void
xmlParseXMLDecl(xmlParserCtxtPtr ctxt) {
    xmlChar *version;

    DEBUG_ENTER(("xmlParseXMLDecl(%s);\n", dbgCtxt(ctxt)));

    /*
     * This value for standalone indicates that the document has an
     * XML declaration but it does not have a standalone attribute.
     * It will be overwritten later if a standalone attribute is found.
     */
    ctxt->input->standalone = -2;

    /*
     * We know that '<?xml' is here.
     */
    if (RAW == '<') {						/* XML */
    	ctxt->mlType = XML_TYPE_XML;
	SKIP(5);
    } else {							/* SML */
    	ctxt->mlType = XML_TYPE_SML;
	SKIP(4); /* SML only has '?xml' */
    }

    if (!IS_BLANK_CH(RAW)) {
	xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
	               "Blank needed after '<?xml'\n");
    }
    SKIP_BLANKS;

    /*
     * We must have the VersionInfo here.
     */
    version = xmlParseVersionInfo(ctxt);
    if (version == NULL) {
	xmlFatalErr(ctxt, XML_ERR_VERSION_MISSING, NULL);
    } else {
	if (!xmlStrEqual(version, (const xmlChar *) XML_DEFAULT_VERSION)) {
	    /*
	     * Changed here for XML-1.0 5th edition
	     */
	    if (ctxt->options & XML_PARSE_OLD10) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_UNKNOWN_VERSION,
			          "Unsupported version '%s'\n",
			          version);
	    } else {
	        if ((version[0] == '1') && ((version[1] == '.'))) {
		    xmlWarningMsg(ctxt, XML_WAR_UNKNOWN_VERSION,
		                  "Unsupported version '%s'\n",
				  version, NULL);
		} else {
		    xmlFatalErrMsgStr(ctxt, XML_ERR_UNKNOWN_VERSION,
				      "Unsupported version '%s'\n",
				      version);
		}
	    }
	}
	if (ctxt->version != NULL)
	    xmlFree((void *) ctxt->version);
	ctxt->version = version;
    }

    /*
     * We may have the encoding declaration
     */
    if (ISXML) {						/* XML */
	if (!IS_BLANK_CH(RAW)) {
	    if ((RAW == '?') && (NXT(1) == '>')) {
		SKIP(2);
		RETURN();
	    }
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED, "Blank needed here\n");
	}
    } else {							/* SML */
    	if (RAW == ';') { SKIP(1); RETURN(); }
    	if (RAW == '\n') RETURN();
	if (!IS_BLANK_CH(RAW)) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED, "Blank needed here\n");
	}
    }
    xmlParseEncodingDecl(ctxt);
    if ((ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) ||
         (ctxt->instate == XML_PARSER_EOF)) {
	/*
	 * The XML REC instructs us to stop parsing right here
	 */
        RETURN();
    }

    /*
     * We may have the standalone status.
     */
    if (ISXML) {						/* XML */
	if ((ctxt->input->encoding != NULL) && (!IS_BLANK_CH(RAW))) {
	    if ((RAW == '?') && (NXT(1) == '>')) {
		SKIP(2);
		RETURN();
	    }
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED, "Blank needed here\n");
	}
    } else {							/* SML */
    	if (RAW == ';') { SKIP(1); RETURN(); }
    	if (RAW == '\n') RETURN();
	if (!IS_BLANK_CH(RAW)) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED, "Blank needed here\n");
	}
    }

    /*
     * We can grow the input buffer freely at that point
     */
    GROW;

    SKIP_BLANKS;
    ctxt->input->standalone = xmlParseSDDecl(ctxt);

    SKIP_BLANKS;
    if (ISXML) {						/* XML */
	if ((RAW == '?') && (NXT(1) == '>')) {
	    SKIP(2);
	} else if (RAW == '>') {
	    /* Deprecated old WD ... */
	    xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	    NEXT;
	} else {
	    xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	    MOVETO_ENDTAG(CUR_PTR);
	    NEXT;
	}
    } else {							/* SML */
    	if (RAW == ';') { SKIP(1); RETURN(); }
    	if (RAW == '\n') RETURN();
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	MOVETO_ENDSMLTAG(CUR_PTR);
	NEXT;
    }
    RETURN();
}